

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O0

bool not_empty(v_array<v_array<unsigned_int>_> tournaments)

{
  size_t sVar1;
  v_array<unsigned_int> *this;
  size_t i;
  ulong local_10;
  
  local_10 = 0;
  while( true ) {
    sVar1 = v_array<v_array<unsigned_int>_>::size
                      ((v_array<v_array<unsigned_int>_> *)&stack0x00000008);
    if (sVar1 <= local_10) {
      return false;
    }
    this = v_array<v_array<unsigned_int>_>::operator[]
                     ((v_array<v_array<unsigned_int>_> *)&stack0x00000008,local_10);
    sVar1 = v_array<unsigned_int>::size(this);
    if (sVar1 != 0) break;
    local_10 = local_10 + 1;
  }
  return true;
}

Assistant:

bool not_empty(v_array<v_array<uint32_t>> tournaments)
{
  for (size_t i = 0; i < tournaments.size(); i++)
  {
    if (tournaments[i].size() > 0)
      return true;
  }
  return false;
}